

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-wast-parser.cc
# Opt level: O2

void __thiscall
WastParser_LongToken_Test::~WastParser_LongToken_Test(WastParser_LongToken_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(WastParser, LongToken) {
  std::string text;
  text = "(module (memory ";
  text += repeat("a", 0x5000);
  text += "))";

  Errors errors = ParseInvalidModule(text);
  ASSERT_EQ(1u, errors.size());

  ASSERT_EQ(ErrorLevel::Error, errors[0].error_level);
  ASSERT_EQ(1, errors[0].loc.line);
  ASSERT_EQ(17, errors[0].loc.first_column);
  ASSERT_STREQ(
      R"(unexpected token "aaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaa...", expected a natural number (e.g. 123).)",
      errors[0].message.c_str());
}